

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

bool __thiscall
spvc_resources_s::copy_resources
          (spvc_resources_s *this,SmallVector<spvc_reflected_builtin_resource,_8UL> *outputs,
          SmallVector<spirv_cross::BuiltInResource,_8UL> *inputs)

{
  spvc_type_id *psVar1;
  SpvBuiltIn SVar2;
  size_t sVar3;
  spvc_reflected_builtin_resource *psVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  char *pcVar8;
  bool bVar9;
  BuiltInResource *pBVar10;
  BuiltInResource *pBVar11;
  spvc_type_id local_48;
  spvc_variable_id sStack_44;
  spvc_type_id sStack_40;
  
  sVar3 = (inputs->super_VectorView<spirv_cross::BuiltInResource>).buffer_size;
  if (sVar3 == 0) {
    bVar9 = true;
  }
  else {
    pBVar11 = (inputs->super_VectorView<spirv_cross::BuiltInResource>).ptr;
    pBVar10 = pBVar11 + sVar3;
    do {
      SVar2 = pBVar11->builtin;
      uVar5 = pBVar11->value_type_id;
      uVar6 = (pBVar11->resource).id;
      uVar7 = (pBVar11->resource).type_id;
      pcVar8 = spvc_context_s::allocate_name(this->context,&(pBVar11->resource).name);
      bVar9 = pcVar8 != (char *)0x0;
      if (pcVar8 == (char *)0x0) {
        return bVar9;
      }
      spirv_cross::SmallVector<spvc_reflected_builtin_resource,_8UL>::reserve
                (outputs,(outputs->super_VectorView<spvc_reflected_builtin_resource>).buffer_size +
                         1);
      psVar4 = (outputs->super_VectorView<spvc_reflected_builtin_resource>).ptr;
      sVar3 = (outputs->super_VectorView<spvc_reflected_builtin_resource>).buffer_size;
      psVar4[sVar3].builtin = SVar2;
      psVar1 = &psVar4[sVar3].value_type_id;
      *psVar1 = uVar5;
      ((spvc_reflected_resource *)(psVar1 + 1))->id = uVar6;
      psVar1[2] = uVar6;
      psVar1[3] = uVar7;
      psVar4[sVar3].resource.name = pcVar8;
      (outputs->super_VectorView<spvc_reflected_builtin_resource>).buffer_size = sVar3 + 1;
      pBVar11 = pBVar11 + 1;
    } while (pBVar11 != pBVar10);
  }
  return bVar9;
}

Assistant:

bool spvc_resources_s::copy_resources(SmallVector<spvc_reflected_builtin_resource> &outputs,
                                      const SmallVector<BuiltInResource> &inputs)
{
	for (auto &i : inputs)
	{
		spvc_reflected_builtin_resource br;

		br.value_type_id = i.value_type_id;
		br.builtin = SpvBuiltIn(i.builtin);

		auto &r = br.resource;
		r.base_type_id = i.resource.base_type_id;
		r.type_id = i.resource.type_id;
		r.id = i.resource.id;
		r.name = context->allocate_name(i.resource.name);
		if (!r.name)
			return false;

		outputs.push_back(br);
	}

	return true;
}